

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

BOOL Js::JavascriptOperators::DefineOwnPropertyDescriptor
               (RecyclableObject *obj,PropertyId propId,PropertyDescriptor *descriptor,
               bool throwOnError,ScriptContext *scriptContext,PropertyOperationFlags flags)

{
  _func_int **pp_Var1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  undefined4 *puVar6;
  PropertyDescriptor *currentDescriptor_00;
  undefined1 local_70 [8];
  PropertyDescriptor currentDescriptor;
  
  currentDescriptor._40_8_ = descriptor;
  if (obj == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x2392,"(obj)","obj");
    if (!bVar3) goto LAB_00abc13b;
    *puVar6 = 0;
  }
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x2393,"(scriptContext)","scriptContext");
    if (!bVar3) {
LAB_00abc13b:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  bVar3 = VarIs<Js::JavascriptProxy,Js::RecyclableObject>(obj);
  if (bVar3) {
    BVar4 = JavascriptProxy::DefineOwnPropertyDescriptor
                      (obj,propId,(PropertyDescriptor *)currentDescriptor._40_8_,throwOnError,
                       scriptContext,flags);
    return BVar4;
  }
  pp_Var1 = (obj->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
  ;
  if (((pp_Var1 == (_func_int **)VirtualTableInfo<Js::CustomExternalWrapperObject>::Address) ||
      (pp_Var1 ==
       (_func_int **)
       VirtualTableInfo<Js::CrossSiteObject<Js::CustomExternalWrapperObject>_>::Address)) &&
     (BVar4 = CustomExternalWrapperObject::DefineOwnPropertyDescriptor
                        (obj,propId,(PropertyDescriptor *)currentDescriptor._40_8_,throwOnError,
                         scriptContext), BVar4 != 0)) {
    return 1;
  }
  PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_70);
  BVar4 = GetOwnPropertyDescriptor(obj,propId,scriptContext,(PropertyDescriptor *)local_70);
  iVar5 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
            [0x33])(obj);
  currentDescriptor_00 = (PropertyDescriptor *)0x0;
  if (BVar4 != 0) {
    currentDescriptor_00 = (PropertyDescriptor *)local_70;
  }
  BVar4 = ValidateAndApplyPropertyDescriptor<true>
                    (obj,propId,(PropertyDescriptor *)currentDescriptor._40_8_,currentDescriptor_00,
                     iVar5 != 0,throwOnError,scriptContext);
  return BVar4;
}

Assistant:

BOOL JavascriptOperators::DefineOwnPropertyDescriptor(RecyclableObject* obj, PropertyId propId, const PropertyDescriptor& descriptor, bool throwOnError, ScriptContext* scriptContext, PropertyOperationFlags flags /*  = Js::PropertyOperation_None */)
    {
        Assert(obj);
        Assert(scriptContext);

        if (VarIs<JavascriptProxy>(obj))
        {
            return JavascriptProxy::DefineOwnPropertyDescriptor(obj, propId, descriptor, throwOnError, scriptContext, flags);
        }
#ifdef _CHAKRACOREBUILD
        else if (VarIs<CustomExternalWrapperObject>(obj))
        {
            // See if there is a trap for defineProperty.
            BOOL wrapperResult = CustomExternalWrapperObject::DefineOwnPropertyDescriptor(obj, propId, descriptor, throwOnError, scriptContext);
            if (wrapperResult)
            {
                return TRUE;
            }
        }
#endif

        PropertyDescriptor currentDescriptor;
        BOOL isCurrentDescriptorDefined = JavascriptOperators::GetOwnPropertyDescriptor(obj, propId, scriptContext, &currentDescriptor);

        bool isExtensible = !!obj->IsExtensible();
        return ValidateAndApplyPropertyDescriptor<true>(obj, propId, descriptor, isCurrentDescriptorDefined ? &currentDescriptor : nullptr, isExtensible, throwOnError, scriptContext);
    }